

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

bool __thiscall Json::Value::removeIndex(Value *this,ArrayIndex index,Value *removed)

{
  ushort uVar1;
  ValueHolder VVar2;
  CommentInfo *pCVar3;
  ValueHolder VVar4;
  size_t sVar5;
  size_t sVar6;
  ValueHolder VVar7;
  ValueHolder VVar8;
  ArrayIndex AVar9;
  iterator iVar10;
  Value *other;
  ValueHolder *pVVar11;
  undefined1 uVar12;
  undefined8 unaff_RBX;
  ulong uVar13;
  anon_union_4_2_4572b0f8_for_CZString_1 index_00;
  anon_union_4_2_4572b0f8_for_CZString_1 aVar14;
  bool bVar15;
  CZString keyLast;
  CZString key;
  key_type local_a8;
  uint local_94;
  key_type local_90;
  ValueHolder local_80;
  ushort local_78;
  ValueHolder local_70;
  ValueHolder local_68;
  ValueHolder VStack_60;
  ValueHolder local_58;
  ushort local_50;
  CommentInfo *local_48;
  size_t local_40;
  size_t sStack_38;
  
  if (this->field_0x8 == '\x06') {
    local_90.cstr_ = (char *)0x0;
    local_90.field_1.index_ = index;
    iVar10 = std::
             _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
             ::find(&((this->value_).map_)->_M_t,&local_90);
    bVar15 = (_Rb_tree_header *)iVar10._M_node !=
             &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header;
    uVar13 = CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar15);
    if (bVar15) {
      local_94 = (uint)uVar13;
      Value((Value *)&local_58,(Value *)&iVar10._M_node[1]._M_left);
      uVar1 = *(ushort *)&removed->field_0x8;
      VVar2 = removed->value_;
      removed->value_ = local_58;
      *(ushort *)&removed->field_0x8 = local_50 & 0x1ff | uVar1 & 0xfe00;
      local_50 = uVar1 & 0x1ff | local_50 & 0xfe00;
      pCVar3 = removed->comments_;
      removed->comments_ = local_48;
      sVar5 = removed->start_;
      sVar6 = removed->limit_;
      removed->start_ = local_40;
      removed->limit_ = sStack_38;
      local_58 = VVar2;
      local_48 = pCVar3;
      local_40 = sVar5;
      sStack_38 = sVar6;
      ~Value((Value *)&local_58);
      AVar9 = size(this);
      aVar14.index_ = AVar9 - 1;
      if (index < aVar14.index_) {
        local_a8.field_1.index_ = index;
        do {
          local_a8.cstr_ = (char *)0x0;
          index_00.index_ = local_a8.field_1.index_ + 1;
          other = operator[](this,index_00.index_);
          Value((Value *)&local_80,other);
          pVVar11 = &std::
                     map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                     ::operator[]((this->value_).map_,&local_a8)->value_;
          uVar1 = *(ushort *)(pVVar11 + 1);
          VVar2 = *pVVar11;
          *pVVar11 = local_80;
          *(ushort *)(pVVar11 + 1) = local_78 & 0x1ff | uVar1 & 0xfe00;
          local_78 = uVar1 & 0x1ff | local_78 & 0xfe00;
          VVar4 = pVVar11[2];
          pVVar11[2] = local_70;
          VVar7 = pVVar11[3];
          VVar8 = pVVar11[4];
          pVVar11[3] = local_68;
          pVVar11[4] = VStack_60;
          local_80 = VVar2;
          local_70 = VVar4;
          local_68 = VVar7;
          VStack_60 = VVar8;
          ~Value((Value *)&local_80);
          if ((local_a8.cstr_ != (char *)0x0) && ((local_a8.field_1.index_ & 3) == 1)) {
            free(local_a8.cstr_);
          }
          local_a8.field_1.index_ = index_00.index_;
        } while (aVar14.index_ != index_00.index_);
      }
      local_a8.cstr_ = (char *)0x0;
      local_a8.field_1.index_ = aVar14.index_;
      iVar10 = std::
               _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
               ::find(&((this->value_).map_)->_M_t,&local_a8);
      std::
      _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::_M_erase_aux(&((this->value_).map_)->_M_t,(const_iterator)iVar10._M_node);
      uVar13 = (ulong)local_94;
      if ((local_a8.cstr_ != (char *)0x0) && ((local_a8.field_1.index_ & 3) == 1)) {
        free(local_a8.cstr_);
      }
    }
    uVar12 = (undefined1)uVar13;
    if ((local_90.cstr_ != (char *)0x0) && ((local_90.field_1.index_ & 3) == 1)) {
      free(local_90.cstr_);
    }
  }
  else {
    uVar12 = 0;
  }
  return (bool)uVar12;
}

Assistant:

bool Value::removeIndex(ArrayIndex index, Value* removed) {
  if (type_ != arrayValue) {
    return false;
  }
  CZString key(index);
  ObjectValues::iterator it = value_.map_->find(key);
  if (it == value_.map_->end()) {
    return false;
  }
  *removed = it->second;
  ArrayIndex oldSize = size();
  // shift left all items left, into the place of the "removed"
  for (ArrayIndex i = index; i < (oldSize - 1); ++i){
    CZString key(i);
    (*value_.map_)[key] = (*this)[i + 1];
  }
  // erase the last one ("leftover")
  CZString keyLast(oldSize - 1);
  ObjectValues::iterator itLast = value_.map_->find(keyLast);
  value_.map_->erase(itLast);
  return true;
}